

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O3

optional<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>_> * __thiscall
supermap::
SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int,_void,_supermap::Key<2UL>_>
::find(optional<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>_>
       *__return_storage_ptr__,
      SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int,_void,_supermap::Key<2UL>_>
      *this,Key<2UL> *pattern,
      function<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>_&,_const_supermap::Key<2UL>_&)>
      *less,function<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>_&,_const_supermap::Key<2UL>_&)>
            *equal)

{
  optional<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>_> *poVar1;
  uint uVar2;
  uint uVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  undefined4 *puVar7;
  uint uVar8;
  uint uVar9;
  Key<2UL> local_58 [4];
  undefined4 *local_50;
  function<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>_&,_const_supermap::Key<2UL>_&)>
  *local_48;
  Key<2UL> *local_40;
  optional<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>_> *local_38;
  
  local_40 = pattern;
  iVar5 = (*(this->
            super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int,_void>
            ).
            super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int,_void>
            .
            super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int,_void>
            ._vptr_OrderedStorage[1])(this);
  if (iVar5 != 0) {
    local_48 = equal;
    local_38 = __return_storage_ptr__;
    uVar6 = (*(this->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int,_void>
              ).
              super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int,_void>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int,_void>
              ._vptr_OrderedStorage[1])(this);
    uVar8 = 0;
    if (1 < uVar6) {
      uVar8 = 0;
      do {
        uVar9 = uVar6 + uVar8 >> 1;
        (*(this->
          super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int,_void>
          ).
          super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int,_void>
          .
          super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int,_void>
          ._vptr_OrderedStorage[4])(local_58,this,(ulong)uVar9);
        if (*(long *)(less + 0x10) == 0) {
LAB_0012e951:
          std::__throw_bad_function_call();
        }
        cVar4 = (**(code **)(less + 0x18))(less,local_58,local_40);
        uVar2 = uVar9;
        uVar3 = uVar6;
        if (cVar4 == '\0') {
          if (*(long *)(local_48 + 0x10) == 0) goto LAB_0012e951;
          cVar4 = (**(code **)(local_48 + 0x18))(local_48,local_58,local_40);
          uVar2 = uVar8;
          uVar3 = uVar9;
          if (cVar4 != '\0') {
            uVar2 = uVar9;
            uVar3 = uVar6;
          }
        }
        uVar6 = uVar3;
        uVar8 = uVar2;
        if (local_50 != (undefined4 *)0x0) {
          operator_delete__(local_50);
        }
      } while (1 < uVar6 - uVar8);
    }
    uVar6 = (*(this->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int,_void>
              ).
              super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int,_void>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int,_void>
              ._vptr_OrderedStorage[1])(this);
    __return_storage_ptr__ = local_38;
    if (uVar8 < uVar6) {
      (*(this->
        super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int,_void>
        ).
        super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int,_void>
        .
        super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int,_void>
        ._vptr_OrderedStorage[4])(local_58,this,(ulong)uVar8);
      if (*(long *)(local_48 + 0x10) == 0) {
        std::__throw_bad_function_call();
      }
      cVar4 = (**(code **)(local_48 + 0x18))(local_48,local_58,local_40);
      poVar1 = local_38;
      if (cVar4 == '\0') {
        (local_38->
        super__Optional_base<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_true,_false,_false>
        .
        super__Optional_payload_base<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>_>
        ._M_engaged = false;
        if (local_50 == (undefined4 *)0x0) {
          return local_38;
        }
      }
      else {
        (local_38->
        super__Optional_base<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_true,_false,_false>
        .
        super__Optional_payload_base<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>_>
        ._M_payload._M_value.key.super_array<unsigned_char,_2UL> =
             local_58[0].super_array<unsigned_char,_2UL>._M_elems;
        puVar7 = (undefined4 *)operator_new__(4);
        *puVar7 = 0;
        *(undefined4 **)
         ((long)&(poVar1->
                 super__Optional_base<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>_>
                 ._M_payload + 8) = puVar7;
        *puVar7 = *local_50;
        (poVar1->
        super__Optional_base<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_true,_false,_false>
        .
        super__Optional_payload_base<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>_>
        ._M_engaged = true;
      }
      operator_delete__(local_50);
      return poVar1;
    }
  }
  (__return_storage_ptr__->
  super__Optional_base<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_true,_false,_false>
  .super__Optional_payload_base<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>_>.
  _M_engaged = false;
  return __return_storage_ptr__;
}

Assistant:

std::optional<T> find(
        const FindPattern &pattern,
        std::function<bool(const T &, const FindPattern &)> less,
        std::function<bool(const T &, const FindPattern &)> equal
    ) override {
        if (getItemsCount() == 0) {
            return std::nullopt;
        }
        IndexT firstLeq = 0;
        IndexT lastGt = getItemsCount();
        while (lastGt - firstLeq > 1) {
            IndexT middle = (firstLeq + lastGt) / 2;
            T middleElem = get(middle);
            if (less(middleElem, pattern) || equal(middleElem, pattern)) {
                firstLeq = middle;
            } else {
                lastGt = middle;
            }
        }
        if (firstLeq >= getItemsCount()) {
            return std::nullopt;
        }
        T firstLeqElem = get(firstLeq);
        return equal(firstLeqElem, pattern) ? std::optional{firstLeqElem} : std::nullopt;
    }